

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentSpecNode.cpp
# Opt level: O3

void __thiscall xercesc_4_0::ContentSpecNode::formatSpec(ContentSpecNode *this,XMLBuffer *bufToFill)

{
  ValueVectorOf<xercesc_4_0::formatNodeHolder> *this_00;
  ContentSpecNode *pCVar1;
  ContentSpecNode *pCVar2;
  bool bVar3;
  int iVar4;
  NodeTypes NVar5;
  undefined4 extraout_var;
  XMLSize_t XVar6;
  ContentSpecNode *pCVar7;
  XMLSize_t XVar8;
  XMLCh *pXVar9;
  XMLSize_t XVar10;
  NodeTypes NVar11;
  formatNodeHolder fVar12;
  ValueStackOf<xercesc_4_0::formatNodeHolder> local_70;
  uint local_3c;
  ContentSpecNode *local_38;
  
  bufToFill->fIndex = 0;
  if (this->fType == Leaf) {
    if (bufToFill->fCapacity == 0) {
      XMLBuffer::ensureCapacity(bufToFill,1);
      XVar6 = bufToFill->fIndex;
    }
    else {
      XVar6 = 0;
    }
    bufToFill->fIndex = XVar6 + 1;
    bufToFill->fBuffer[XVar6] = L'(';
  }
  local_70.fVector.fMemoryManager = this->fMemoryManager;
  local_70.fVector.fCallDestructor = false;
  local_70.fVector.fCurCount = 0;
  local_70.fVector.fMaxCount = 10;
  local_70.fVector.fElemList = (formatNodeHolder *)0x0;
  iVar4 = (*(local_70.fVector.fMemoryManager)->_vptr_MemoryManager[3])();
  local_70.fVector.fElemList = (formatNodeHolder *)CONCAT44(extraout_var,iVar4);
  memset(local_70.fVector.fElemList,0,0xa0);
  ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
  XVar6 = local_70.fVector.fCurCount + 1;
  local_70.fVector.fElemList[local_70.fVector.fCurCount].node = this;
  local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
  local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'\0';
  local_70.fVector.fCurCount = XVar6;
  local_38 = this;
  if (XVar6 != 0) {
    local_3c = 0xffffffff;
    do {
      fVar12 = ValueStackOf<xercesc_4_0::formatNodeHolder>::pop(&local_70);
      pCVar7 = fVar12.node;
      if (fVar12.character != L'\0') {
        XVar6 = bufToFill->fIndex;
        if (XVar6 == bufToFill->fCapacity) {
          XMLBuffer::ensureCapacity(bufToFill,1);
          XVar6 = bufToFill->fIndex;
        }
        bufToFill->fIndex = XVar6 + 1;
        bufToFill->fBuffer[XVar6] = fVar12.character;
        goto switchD_002e5e2f_caseD_6;
      }
      if (pCVar7 == (ContentSpecNode *)0x0) goto switchD_002e5e2f_caseD_6;
      pCVar1 = pCVar7->fFirst;
      NVar11 = fVar12.parentType;
      if (pCVar1 == (ContentSpecNode *)0x0) {
        NVar5 = Leaf;
LAB_002e5dfa:
        bVar3 = false;
        if ((NVar11 == UnknownType) && (NVar5 == Leaf)) goto LAB_002e5e06;
      }
      else {
        NVar5 = pCVar1->fType;
        if ((NVar11 == UnknownType) || (NVar5 == Leaf)) goto LAB_002e5dfa;
LAB_002e5e06:
        bVar3 = true;
      }
      NVar5 = pCVar7->fType;
      if (9 < (uint)(NVar5 & (Any_NS|Any_Other))) goto switchD_002e5e2f_caseD_6;
      pCVar2 = pCVar7->fSecond;
      switch(NVar5 & (Any_NS|Any_Other)) {
      case Leaf:
        if (pCVar7->fElement->fURIId == local_3c) {
          XMLBuffer::append(bufToFill,(XMLCh *)XMLElementDecl::fgPCDataElemName);
        }
        else {
          pXVar9 = QName::getRawName(pCVar7->fElement);
          XMLBuffer::append(bufToFill,pXVar9);
          if (pCVar7->fMinOccurs == 1) {
            if (pCVar7->fMaxOccurs == -1 || 1 < pCVar7->fMaxOccurs) {
              XVar6 = bufToFill->fIndex;
              if (XVar6 == bufToFill->fCapacity) {
                XMLBuffer::ensureCapacity(bufToFill,1);
                XVar6 = bufToFill->fIndex;
              }
              bufToFill->fIndex = XVar6 + 1;
              bufToFill->fBuffer[XVar6] = L'+';
            }
          }
          else if (pCVar7->fMinOccurs == 0) {
            iVar4 = pCVar7->fMaxOccurs;
            if (iVar4 == -1 || 1 < iVar4) {
              XVar6 = bufToFill->fIndex;
              if (XVar6 == bufToFill->fCapacity) {
                XMLBuffer::ensureCapacity(bufToFill,1);
                XVar6 = bufToFill->fIndex;
              }
              bufToFill->fIndex = XVar6 + 1;
              bufToFill->fBuffer[XVar6] = L'*';
            }
            else if (iVar4 == 1) {
              XVar6 = bufToFill->fIndex;
              if (XVar6 == bufToFill->fCapacity) {
                XMLBuffer::ensureCapacity(bufToFill,1);
                XVar6 = bufToFill->fIndex;
              }
              bufToFill->fIndex = XVar6 + 1;
              bufToFill->fBuffer[XVar6] = L'?';
            }
          }
        }
        goto switchD_002e5e2f_caseD_6;
      case ZeroOrOne:
        if (bVar3) {
          XVar6 = bufToFill->fIndex;
          if (XVar6 == bufToFill->fCapacity) {
            XMLBuffer::ensureCapacity(bufToFill,1);
            XVar6 = bufToFill->fIndex;
          }
          bufToFill->fIndex = XVar6 + 1;
          bufToFill->fBuffer[XVar6] = L'(';
        }
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
        XVar6 = local_70.fVector.fCurCount + 1;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'?';
        local_70.fVector.fCurCount = XVar6;
        if (bVar3) {
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L')';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
        break;
      case ZeroOrMore:
        if (bVar3) {
          XVar6 = bufToFill->fIndex;
          if (XVar6 == bufToFill->fCapacity) {
            XMLBuffer::ensureCapacity(bufToFill,1);
            XVar6 = bufToFill->fIndex;
          }
          bufToFill->fIndex = XVar6 + 1;
          bufToFill->fBuffer[XVar6] = L'(';
        }
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
        XVar6 = local_70.fVector.fCurCount + 1;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'*';
        local_70.fVector.fCurCount = XVar6;
        if (bVar3) {
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L')';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
        break;
      case OneOrMore:
        if (bVar3) {
          XVar6 = bufToFill->fIndex;
          if (XVar6 == bufToFill->fCapacity) {
            XMLBuffer::ensureCapacity(bufToFill,1);
            XVar6 = bufToFill->fIndex;
          }
          bufToFill->fIndex = XVar6 + 1;
          bufToFill->fBuffer[XVar6] = L'(';
        }
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
        XVar6 = local_70.fVector.fCurCount + 1;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'+';
        local_70.fVector.fCurCount = XVar6;
        if (bVar3) {
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L')';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
        break;
      case Choice:
        if ((NVar11 & (Any_NS|Any_Other)) != Choice) {
          XVar6 = bufToFill->fIndex;
          if (XVar6 == bufToFill->fCapacity) {
            XMLBuffer::ensureCapacity(bufToFill,1);
            XVar6 = bufToFill->fIndex;
          }
          bufToFill->fIndex = XVar6 + 1;
          bufToFill->fBuffer[XVar6] = L'(';
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L')';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        if (pCVar2 != (ContentSpecNode *)0x0) {
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = pCVar2;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = NVar5;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'\0';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'|';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
        break;
      case Sequence:
        if ((NVar11 & (Any_NS|Any_Other)) != Sequence) {
          XVar6 = bufToFill->fIndex;
          if (XVar6 == bufToFill->fCapacity) {
            XMLBuffer::ensureCapacity(bufToFill,1);
            XVar6 = bufToFill->fIndex;
          }
          bufToFill->fIndex = XVar6 + 1;
          bufToFill->fBuffer[XVar6] = L'(';
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L')';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        if (pCVar2 != (ContentSpecNode *)0x0) {
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = pCVar2;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = NVar5;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'\0';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L',';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
        break;
      default:
        goto switchD_002e5e2f_caseD_6;
      case All:
        if ((NVar11 & (Any_NS|Any_Other)) != All) {
          XVar6 = bufToFill->fIndex;
          XVar8 = bufToFill->fCapacity;
          if (XVar6 == XVar8) {
            XMLBuffer::ensureCapacity(bufToFill,1);
            XVar6 = bufToFill->fIndex;
            XVar8 = bufToFill->fCapacity;
          }
          pXVar9 = bufToFill->fBuffer;
          XVar10 = XVar6 + 1;
          bufToFill->fIndex = XVar10;
          pXVar9[XVar6] = L'A';
          if (XVar10 == XVar8) {
            XMLBuffer::ensureCapacity(bufToFill,1);
            XVar10 = bufToFill->fIndex;
            XVar8 = bufToFill->fCapacity;
            pXVar9 = bufToFill->fBuffer;
          }
          XVar6 = XVar10 + 1;
          bufToFill->fIndex = XVar6;
          pXVar9[XVar10] = L'l';
          if (XVar6 == XVar8) {
            XMLBuffer::ensureCapacity(bufToFill,1);
            XVar6 = bufToFill->fIndex;
            XVar8 = bufToFill->fCapacity;
            pXVar9 = bufToFill->fBuffer;
          }
          XVar10 = XVar6 + 1;
          bufToFill->fIndex = XVar10;
          pXVar9[XVar6] = L'l';
          if (XVar10 == XVar8) {
            XMLBuffer::ensureCapacity(bufToFill,1);
            XVar10 = bufToFill->fIndex;
            pXVar9 = bufToFill->fBuffer;
          }
          bufToFill->fIndex = XVar10 + 1;
          pXVar9[XVar10] = L'(';
          ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(&local_70.fVector,1);
          local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
          local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L')';
          local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        }
        this_00 = &local_70.fVector;
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(this_00,1);
        local_70.fVector.fElemList[local_70.fVector.fCurCount].node = pCVar2;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = NVar5;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'\0';
        local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(this_00,1);
        local_70.fVector.fElemList[local_70.fVector.fCurCount].node = (ContentSpecNode *)0x0;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = UnknownType;
        local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L',';
        local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
        ValueVectorOf<xercesc_4_0::formatNodeHolder>::ensureExtraCapacity(this_00,1);
      }
      local_70.fVector.fElemList[local_70.fVector.fCurCount].node = pCVar1;
      local_70.fVector.fElemList[local_70.fVector.fCurCount].parentType = NVar5;
      local_70.fVector.fElemList[local_70.fVector.fCurCount].character = L'\0';
      local_70.fVector.fCurCount = local_70.fVector.fCurCount + 1;
switchD_002e5e2f_caseD_6:
    } while (local_70.fVector.fCurCount != 0);
  }
  (*(local_70.fVector.fMemoryManager)->_vptr_MemoryManager[4])
            (local_70.fVector.fMemoryManager,local_70.fVector.fElemList);
  if (local_38->fType == Leaf) {
    XVar6 = bufToFill->fIndex;
    if (XVar6 == bufToFill->fCapacity) {
      XMLBuffer::ensureCapacity(bufToFill,1);
      XVar6 = bufToFill->fIndex;
    }
    bufToFill->fIndex = XVar6 + 1;
    bufToFill->fBuffer[XVar6] = L')';
  }
  return;
}

Assistant:

void ContentSpecNode::formatSpec(XMLBuffer&      bufToFill) const
{
    // Clean out the buffer first
    bufToFill.reset();

    if (fType == ContentSpecNode::Leaf)
        bufToFill.append(chOpenParen);
    formatNode
    (
        this
		, bufToFill
        , fMemoryManager
    );
    if (fType == ContentSpecNode::Leaf)
        bufToFill.append(chCloseParen);
}